

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::ProcessBailOutConstants
          (BackwardPass *this,BailOutInfo *bailOutInfo,
          BVSparse<Memory::JitArenaAllocator> *byteCodeUpwardExposedUsed,
          BVSparse<Memory::JitArenaAllocator> *bailoutReferencedArgSymsBv)

{
  JitArenaAllocator *allocator;
  code *pcVar1;
  ConstantStackSymValue *this_00;
  bool bVar2;
  BOOLEAN BVar3;
  undefined4 *puVar4;
  Type_conflict node;
  Type *this_01;
  StackSym *pSVar5;
  SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
  *this_02;
  KeyValuePair<StackSym_*,_BailoutConstantValue> local_98;
  Type *local_80;
  ConstantStackSymValue *value_1;
  EditingIterator iter;
  GeneratorBailInInstr *bailInInstr;
  ConstantStackSymValue *value;
  Iterator __iter;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
  *usedConstantValues;
  BVSparse<Memory::JitArenaAllocator> *bailoutReferencedArgSymsBv_local;
  BVSparse<Memory::JitArenaAllocator> *byteCodeUpwardExposedUsed_local;
  BailOutInfo *bailOutInfo_local;
  BackwardPass *this_local;
  
  if (this->tag == BackwardPhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x6e3,"(this->tag != Js::BackwardPhase)","this->tag != Js::BackwardPhase");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  __iter.current = (NodeBase *)bailOutInfo->usedCapturedValues;
  _value = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
           ::GetIterator((SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                          *)__iter.current);
  while( true ) {
    if (__iter.list ==
        (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_00 = value;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar2 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                      *)this_00,node);
    if (bVar2) break;
    SListNodeBase<Memory::ArenaAllocator>::Next
              (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    this_01 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              ::Iterator::Data((Iterator *)&value);
    pSVar5 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Key(this_01);
    BVSparse<Memory::JitArenaAllocator>::Clear(byteCodeUpwardExposedUsed,(pSVar5->super_Sym).m_id);
    pSVar5 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Key(this_01);
    BVSparse<Memory::JitArenaAllocator>::Clear(bailoutReferencedArgSymsBv,(pSVar5->super_Sym).m_id);
  }
  iter.last = (NodeBase *)bailOutInfo->bailInInstr;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
  ::GetEditingIterator((EditingIterator *)&value_1,&bailOutInfo->capturedValues->constantValues);
LAB_004cdabb:
  do {
    bVar2 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            ::EditingIterator::Next((EditingIterator *)&value_1);
    if (!bVar2) {
      return;
    }
    local_80 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
               ::Iterator::Data((Iterator *)&value_1);
    if (iter.last != (NodeBase *)0x0) {
      this_02 = (SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
                 *)(iter.last + 0x17);
      allocator = this->func->m_alloc;
      JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::KeyValuePair(&local_98,local_80);
      SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
      ::PrependNode<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>>
                (this_02,&allocator->super_ArenaAllocator,&local_98);
    }
    pSVar5 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Key(local_80);
    BVar3 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                      (byteCodeUpwardExposedUsed,(pSVar5->super_Sym).m_id);
    if (BVar3 == '\0') {
      pSVar5 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Key(local_80);
      BVar3 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                        (bailoutReferencedArgSymsBv,(pSVar5->super_Sym).m_id);
      if (BVar3 == '\0') {
        bVar2 = IsPrePass(this);
        if (!bVar2) {
          SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          ::EditingIterator::RemoveCurrent
                    ((EditingIterator *)&value_1,&this->func->m_alloc->super_ArenaAllocator);
        }
        goto LAB_004cdabb;
      }
    }
    SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
    ::EditingIterator::MoveCurrentTo
              ((EditingIterator *)&value_1,
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                *)__iter.current);
  } while( true );
}

Assistant:

void
BackwardPass::ProcessBailOutConstants(BailOutInfo * bailOutInfo, BVSparse<JitArenaAllocator> * byteCodeUpwardExposedUsed, BVSparse<JitArenaAllocator>* bailoutReferencedArgSymsBv)
{
    Assert(this->tag != Js::BackwardPhase);

    // Remove constants that we are already going to restore
    SListBase<ConstantStackSymValue> * usedConstantValues = &bailOutInfo->usedCapturedValues->constantValues;
    FOREACH_SLISTBASE_ENTRY(ConstantStackSymValue, value, usedConstantValues)
    {
        byteCodeUpwardExposedUsed->Clear(value.Key()->m_id);
        bailoutReferencedArgSymsBv->Clear(value.Key()->m_id);
    }
    NEXT_SLISTBASE_ENTRY;

    IR::GeneratorBailInInstr* bailInInstr = bailOutInfo->bailInInstr;

    // Find other constants that we need to restore
    FOREACH_SLISTBASE_ENTRY_EDITING(ConstantStackSymValue, value, &bailOutInfo->capturedValues->constantValues, iter)
    {
        if (bailInInstr)
        {
            // Store all captured constant values for the corresponding bailin instr
            bailInInstr->capturedValues.constantValues.PrependNode(this->func->m_alloc, value);
        }

        if (byteCodeUpwardExposedUsed->TestAndClear(value.Key()->m_id) || bailoutReferencedArgSymsBv->TestAndClear(value.Key()->m_id))
        {
            // Constant need to be restore, move it to the restore list
            iter.MoveCurrentTo(usedConstantValues);
        }
        else if (!this->IsPrePass())
        {
            // Constants don't need to be restored, delete
            iter.RemoveCurrent(this->func->m_alloc);
        }
    }
    NEXT_SLISTBASE_ENTRY_EDITING;
}